

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O2

void ihevc_sao_edge_offset_class1
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,UWORD8 *pu1_src_top_right,UWORD8 *pu1_src_bot_left,
               UWORD8 *pu1_avail,WORD8 *pi1_sao_offset,WORD32 wd,WORD32 ht)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  UWORD8 *pUVar8;
  byte bVar9;
  byte local_e8 [104];
  UWORD8 au1_mask [64];
  WORD8 au1_sign_up [64];
  
  local_e8[0] = 0xff;
  local_e8[1] = 0xff;
  local_e8[2] = 0xff;
  local_e8[3] = 0xff;
  local_e8[4] = 0xff;
  local_e8[5] = 0xff;
  local_e8[6] = 0xff;
  local_e8[7] = 0xff;
  local_e8[8] = 0xff;
  local_e8[9] = 0xff;
  local_e8[10] = 0xff;
  local_e8[0xb] = 0xff;
  local_e8[0xc] = 0xff;
  local_e8[0xd] = 0xff;
  local_e8[0xe] = 0xff;
  local_e8[0xf] = 0xff;
  local_e8[0x10] = 0xff;
  local_e8[0x11] = 0xff;
  local_e8[0x12] = 0xff;
  local_e8[0x13] = 0xff;
  local_e8[0x14] = 0xff;
  local_e8[0x15] = 0xff;
  local_e8[0x16] = 0xff;
  local_e8[0x17] = 0xff;
  local_e8[0x18] = 0xff;
  local_e8[0x19] = 0xff;
  local_e8[0x1a] = 0xff;
  local_e8[0x1b] = 0xff;
  local_e8[0x1c] = 0xff;
  local_e8[0x1d] = 0xff;
  local_e8[0x1e] = 0xff;
  local_e8[0x1f] = 0xff;
  local_e8[0x20] = 0xff;
  local_e8[0x21] = 0xff;
  local_e8[0x22] = 0xff;
  local_e8[0x23] = 0xff;
  local_e8[0x24] = 0xff;
  local_e8[0x25] = 0xff;
  local_e8[0x26] = 0xff;
  local_e8[0x27] = 0xff;
  local_e8[0x28] = 0xff;
  local_e8[0x29] = 0xff;
  local_e8[0x2a] = 0xff;
  local_e8[0x2b] = 0xff;
  local_e8[0x2c] = 0xff;
  local_e8[0x2d] = 0xff;
  local_e8[0x2e] = 0xff;
  local_e8[0x2f] = 0xff;
  local_e8[0x30] = 0xff;
  local_e8[0x31] = 0xff;
  local_e8[0x32] = 0xff;
  local_e8[0x33] = 0xff;
  local_e8[0x34] = 0xff;
  local_e8[0x35] = 0xff;
  local_e8[0x36] = 0xff;
  local_e8[0x37] = 0xff;
  local_e8[0x38] = 0xff;
  local_e8[0x39] = 0xff;
  local_e8[0x3a] = 0xff;
  local_e8[0x3b] = 0xff;
  local_e8[0x3c] = 0xff;
  local_e8[0x3d] = 0xff;
  local_e8[0x3e] = 0xff;
  local_e8[0x3f] = 0xff;
  *pu1_src_top_left = pu1_src_top[(long)wd + -1];
  uVar4 = 0;
  uVar5 = 0;
  if (0 < ht) {
    uVar5 = (ulong)(uint)ht;
  }
  pUVar8 = pu1_src + (long)wd + -1;
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    pu1_src_left[uVar4] = *pUVar8;
    pUVar8 = pUVar8 + src_strd;
  }
  iVar3 = ht + -1;
  uVar5 = 0;
  uVar4 = 0;
  if (0 < wd) {
    uVar4 = (ulong)(uint)wd;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    au1_mask[uVar5 + 0x18] = pu1_src[uVar5 + (long)(src_strd * iVar3)];
  }
  if (pu1_avail[2] == '\0') {
    pUVar8 = pu1_src + src_strd;
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      bVar9 = pUVar8[uVar5] != pu1_src[uVar5];
      if (pUVar8[uVar5] < pu1_src[uVar5]) {
        bVar9 = 0xff;
      }
      local_e8[uVar5 + 0x40] = bVar9;
    }
  }
  else {
    for (uVar5 = 0; pUVar8 = pu1_src, iVar3 = ht, uVar4 != uVar5; uVar5 = uVar5 + 1) {
      bVar9 = pu1_src[uVar5] != pu1_src_top[uVar5];
      if (pu1_src[uVar5] < pu1_src_top[uVar5]) {
        bVar9 = 0xff;
      }
      local_e8[uVar5 + 0x40] = bVar9;
    }
  }
  iVar3 = iVar3 - (uint)(pu1_avail[3] == '\0');
  iVar2 = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  for (; iVar2 != iVar3; iVar2 = iVar2 + 1) {
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      bVar9 = pUVar8[uVar5];
      bVar1 = (pUVar8 + src_strd)[uVar5];
      uVar6 = (uint)(bVar9 != bVar1);
      if (bVar9 < bVar1) {
        uVar6 = 0xffffffff;
      }
      bVar1 = local_e8[uVar5 + 0x40];
      local_e8[uVar5 + 0x40] = -(char)uVar6;
      if (((uint)local_e8[uVar5] &
          gi4_ihevc_table_edge_idx[(long)(char)bVar1 + (long)(int)uVar6 + 2]) != 0) {
        iVar7 = (int)pi1_sao_offset
                     [(uint)local_e8[uVar5] &
                      gi4_ihevc_table_edge_idx[(long)(char)bVar1 + (long)(int)uVar6 + 2]] +
                (uint)bVar9;
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        if (0xfe < iVar7) {
          iVar7 = 0xff;
        }
        pUVar8[uVar5] = (UWORD8)iVar7;
      }
    }
    pUVar8 = pUVar8 + src_strd;
  }
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    pu1_src_top[uVar5] = au1_mask[uVar5 + 0x18];
  }
  return;
}

Assistant:

void ihevc_sao_edge_offset_class1(UWORD8 *pu1_src,
                                  WORD32 src_strd,
                                  UWORD8 *pu1_src_left,
                                  UWORD8 *pu1_src_top,
                                  UWORD8 *pu1_src_top_left,
                                  UWORD8 *pu1_src_top_right,
                                  UWORD8 *pu1_src_bot_left,
                                  UWORD8 *pu1_avail,
                                  WORD8 *pi1_sao_offset,
                                  WORD32 wd,
                                  WORD32 ht)
{
    WORD32 row, col;
    UWORD8 au1_mask[MAX_CTB_SIZE];
    UWORD8 au1_src_top_tmp[MAX_CTB_SIZE];
    WORD8 au1_sign_up[MAX_CTB_SIZE];
    WORD8 u1_sign_down;
    WORD32 bit_depth;
    UNUSED(pu1_src_top_right);
    UNUSED(pu1_src_bot_left);

    bit_depth = BIT_DEPTH_LUMA;

    /* Initialize the mask values */
    memset(au1_mask, 0xFF, MAX_CTB_SIZE);

    /* Update left, top and top-left arrays */
    *pu1_src_top_left = pu1_src_top[wd - 1];
    for(row = 0; row < ht; row++)
    {
        pu1_src_left[row] = pu1_src[row * src_strd + wd - 1];
    }
    for(col = 0; col < wd; col++)
    {
        au1_src_top_tmp[col] = pu1_src[(ht - 1) * src_strd + col];
    }

    /* Update height and source pointers based on the availability flags */
    if(0 == pu1_avail[2])
    {
        pu1_src += src_strd;
        ht--;
        for(col = 0; col < wd; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src[col - src_strd]);
        }
    }
    else
    {
        for(col = 0; col < wd; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src_top[col]);
        }
    }
    if(0 == pu1_avail[3])
    {
        ht--;
    }

    /* Processing is done on the intermediate buffer and the output is written to the source buffer */
    {
        for(row = 0; row < ht; row++)
        {
            for(col = 0; col < wd; col++)
            {
                WORD32 edge_idx;

                u1_sign_down = SIGN(pu1_src[col] - pu1_src[col + src_strd]);
                edge_idx = 2 + au1_sign_up[col] + u1_sign_down;
                au1_sign_up[col] = -u1_sign_down;

                edge_idx = gi4_ihevc_table_edge_idx[edge_idx] & au1_mask[col];

                if(0 != edge_idx)
                {
                    pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
                }
            }

            pu1_src += src_strd;
        }
    }

    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = au1_src_top_tmp[col];
    }

}